

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

off64_t zng_gztell(gzFile file)

{
  uchar *local_28;
  gz_state *state;
  gzFile file_local;
  uchar *local_8;
  
  if (file == (gzFile)0x0) {
    local_8 = (uchar *)0xffffffffffffffff;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if ((int)file[4].pos == 0) {
      local_28 = (uchar *)0x0;
    }
    else {
      local_28 = file[4].next;
    }
    local_8 = local_28 + file->pos;
  }
  else {
    local_8 = (uchar *)0xffffffffffffffff;
  }
  return (off64_t)local_8;
}

Assistant:

z_off64_t Z_EXPORT PREFIX4(gztell)(gzFile file) {
    gz_state *state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_state *)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* return position */
    return state->x.pos + (state->seek ? state->skip : 0);
}